

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult vmaAllocateMemory(VmaAllocator allocator,VkMemoryRequirements *pVkMemoryRequirements,
                          VmaAllocationCreateInfo *pCreateInfo,VmaAllocation *pAllocation,
                          VmaAllocationInfo *pAllocationInfo)

{
  VkResult VVar1;
  
  VVar1 = VmaAllocator_T::AllocateMemory
                    (allocator,pVkMemoryRequirements,false,false,(VkBuffer)0x0,(VkImage)0x0,
                     0xffffffff,pCreateInfo,VMA_SUBALLOCATION_TYPE_UNKNOWN,1,pAllocation);
  if (VVar1 == VK_SUCCESS && pAllocationInfo != (VmaAllocationInfo *)0x0) {
    VmaAllocator_T::GetAllocationInfo(allocator,*pAllocation,pAllocationInfo);
  }
  return VVar1;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaAllocateMemory(
    VmaAllocator allocator,
    const VkMemoryRequirements* pVkMemoryRequirements,
    const VmaAllocationCreateInfo* pCreateInfo,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && pVkMemoryRequirements && pCreateInfo && pAllocation);

    VMA_DEBUG_LOG("vmaAllocateMemory");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    VkResult result = allocator->AllocateMemory(
        *pVkMemoryRequirements,
        false, // requiresDedicatedAllocation
        false, // prefersDedicatedAllocation
        VK_NULL_HANDLE, // dedicatedBuffer
        VK_NULL_HANDLE, // dedicatedImage
        UINT32_MAX, // dedicatedBufferImageUsage
        *pCreateInfo,
        VMA_SUBALLOCATION_TYPE_UNKNOWN,
        1, // allocationCount
        pAllocation);

    if(pAllocationInfo != VMA_NULL && result == VK_SUCCESS)
    {
        allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
    }

    return result;
}